

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_ppm.cpp
# Opt level: O1

void PPM::PredictVelOnFaces
               (Box *bx,Array4<double> *Imx,Array4<double> *Imy,Array4<double> *Imz,
               Array4<double> *Ipx,Array4<double> *Ipy,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *vel,Geometry geom,Real dt,BCRec *pbc)

{
  BCRec *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  double *pdVar73;
  int iVar74;
  long lVar75;
  long lVar76;
  double *pdVar77;
  bool bVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double *local_538;
  double *local_530;
  double *local_520;
  double *local_518;
  double *local_510;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  double *local_4e0;
  double *local_4d8;
  double *local_4d0;
  double *local_4c8;
  double *local_4c0;
  double *local_4b8;
  double *local_4b0;
  double *local_4a8;
  double *local_4a0;
  double *local_498;
  double *local_490;
  double *local_488;
  double *local_480;
  long local_478;
  double *local_470;
  double *local_468;
  long local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_3f0;
  double *local_3e8;
  double *local_3e0;
  double *local_3d8;
  double *local_3d0;
  double *local_3c8;
  double *local_2f8;
  double *local_2a8;
  double *local_2a0;
  double *local_288;
  double *local_280;
  
  lVar22 = Imx->jstride;
  iVar2 = (Imz->begin).x;
  iVar3 = (bx->smallend).vect[0];
  lVar61 = (long)iVar3;
  iVar4 = (bx->smallend).vect[1];
  lVar76 = (long)iVar4;
  iVar5 = (Imy->begin).x;
  lVar23 = Ipx->jstride;
  lVar24 = Ipy->jstride;
  lVar25 = Ipz->jstride;
  uVar6 = (q->begin).y;
  iVar51 = geom.domain.smallend.vect[1] - uVar6;
  lVar26 = q->jstride;
  iVar57 = geom.domain.bigend.vect[1] - uVar6;
  lVar53 = (lVar76 - (int)uVar6) * lVar26;
  lVar75 = (lVar76 - (vel->begin).y) * vel->jstride * 8 + lVar61 * 8;
  uVar7 = (q->begin).x;
  lVar71 = (long)(int)uVar7;
  iVar58 = geom.domain.smallend.vect[0] - uVar7;
  iVar59 = geom.domain.bigend.vect[0] - uVar7;
  uVar8 = (q->begin).z;
  iVar52 = geom.domain.smallend.vect[2] - uVar8;
  iVar60 = geom.domain.bigend.vect[2] - uVar8;
  iVar74 = iVar3 - uVar7;
  lVar27 = q->kstride;
  lVar28 = vel->nstride;
  lVar62 = (long)(vel->begin).x;
  pdVar29 = vel->p;
  lVar30 = vel->kstride;
  iVar9 = (vel->begin).z;
  local_480 = Imx->p + ((lVar61 + (lVar76 - (Imx->begin).y) * lVar22) - (long)(Imx->begin).x);
  pdVar31 = q->p;
  lVar32 = q->nstride;
  lVar33 = Imx->kstride;
  lVar34 = Imx->nstride;
  iVar10 = (Imx->begin).z;
  local_488 = Ipx->p + ((lVar61 + (lVar76 - (Ipx->begin).y) * lVar23) - (long)(Ipx->begin).x);
  lVar35 = Ipx->kstride;
  lVar36 = Ipx->nstride;
  iVar11 = (Ipx->begin).z;
  local_490 = Ipy->p + ((lVar61 + (lVar76 - (Ipy->begin).y) * lVar24) - (long)(Ipy->begin).x);
  pdVar37 = Imy->p;
  lVar38 = Imy->jstride;
  lVar39 = Imy->kstride;
  lVar40 = Imy->nstride;
  iVar12 = (Imy->begin).y;
  iVar13 = (Imy->begin).z;
  lVar41 = Ipy->kstride;
  lVar42 = Ipy->nstride;
  iVar14 = (Ipy->begin).z;
  pdVar43 = Imz->p;
  lVar44 = Imz->jstride;
  lVar45 = Imz->kstride;
  lVar46 = Imz->nstride;
  iVar15 = (Imz->begin).y;
  iVar16 = (Imz->begin).z;
  local_498 = Ipz->p + ((lVar61 + (lVar76 - (Ipz->begin).y) * lVar25) - (long)(Ipz->begin).x);
  lVar47 = Ipz->kstride;
  lVar48 = Ipz->nstride;
  iVar17 = (Ipz->begin).z;
  iVar18 = (bx->smallend).vect[2];
  iVar19 = (bx->bigend).vect[0];
  iVar20 = (bx->bigend).vect[1];
  iVar21 = (bx->bigend).vect[2];
  lVar54 = (long)(int)(geom.domain.smallend.vect[0] + ~uVar7);
  lVar55 = (long)(int)((geom.domain.smallend.vect[0] + 1) - uVar7);
  local_518 = pdVar31 + ((lVar61 + (iVar51 + 2) * lVar26) - lVar71);
  local_4a0 = pdVar31 + ((lVar61 + (iVar51 + 1) * lVar26) - lVar71);
  local_4a8 = pdVar31 + ((lVar61 + iVar51 * lVar26) - lVar71);
  local_4b0 = pdVar31 + ((lVar61 + (int)(geom.domain.smallend.vect[1] + ~uVar6) * lVar26) - lVar71);
  local_4b8 = pdVar31 + ((lVar61 + (int)((geom.domain.smallend.vect[1] + 1) - uVar6) * lVar26) -
                        lVar71);
  local_4c0 = pdVar31 + ((lVar61 + (iVar57 + -2) * lVar26) - lVar71);
  local_4c8 = pdVar31 + ((lVar61 + (int)(~uVar6 + geom.domain.bigend.vect[1]) * lVar26) - lVar71);
  local_4d0 = pdVar31 + ((lVar61 + iVar57 * lVar26) - lVar71);
  local_4d8 = pdVar31 + ((lVar61 + (iVar57 + 1) * lVar26) - lVar71);
  local_4e0 = pdVar31 + ((lVar61 + (int)((geom.domain.bigend.vect[1] + -1) - uVar6) * lVar26) -
                        lVar71);
  local_408 = pdVar31 + (lVar61 - lVar71);
  iVar51 = iVar4 - uVar6;
  local_410 = pdVar31 + (((iVar52 + 2) * lVar27 + lVar61 + lVar53) - lVar71);
  local_418 = pdVar31 + (((iVar52 + 1) * lVar27 + lVar61 + lVar53) - lVar71);
  local_420 = pdVar31 + ((iVar52 * lVar27 + lVar61 + lVar53) - lVar71);
  local_428 = pdVar31 + (((int)(geom.domain.smallend.vect[2] + ~uVar8) * lVar27 + lVar61 + lVar53) -
                        lVar71);
  local_430 = pdVar31 + (((int)((geom.domain.smallend.vect[2] + 1) - uVar8) * lVar27 +
                         lVar61 + lVar53) - lVar71);
  local_438 = pdVar31 + (((iVar60 + -2) * lVar27 + lVar61 + lVar53) - lVar71);
  local_440 = pdVar31 + (((int)(~uVar8 + geom.domain.bigend.vect[2]) * lVar27 + lVar61 + lVar53) -
                        lVar71);
  local_448 = pdVar31 + ((iVar60 * lVar27 + lVar61 + lVar53) - lVar71);
  local_450 = pdVar31 + (((iVar60 + 1) * lVar27 + lVar61 + lVar53) - lVar71);
  local_458 = pdVar31 + (((int)((geom.domain.bigend.vect[2] + -1) - uVar8) * lVar27 +
                         lVar61 + lVar53) - lVar71);
  local_2f8 = pdVar31 + ((lVar61 + lVar53) - lVar71);
  iVar52 = iVar18 - uVar8;
  lVar49 = vel->jstride * 8;
  lVar53 = lVar27 * 8;
  lVar71 = lVar26 * 8;
  local_460 = 0;
  do {
    if (iVar18 <= iVar21) {
      pBVar1 = pbc + local_460;
      lVar68 = local_460 * lVar32;
      iVar57 = iVar18;
      local_504 = iVar52 + 2;
      local_4fc = iVar52 + -1;
      local_4f8 = iVar52 + -2;
      local_500 = iVar52;
      do {
        local_500 = local_500 + 1;
        if (iVar4 <= iVar20) {
          lVar64 = (long)iVar57;
          local_510 = (double *)((lVar64 - iVar10) * lVar33 * 8 + (long)local_480);
          local_520 = (double *)((lVar64 - iVar11) * lVar35 * 8 + (long)local_488);
          local_530 = (double *)((lVar64 - iVar14) * lVar41 * 8 + (long)local_490);
          local_538 = (double *)((lVar64 - iVar17) * lVar47 * 8 + (long)local_498);
          lVar66 = (lVar64 - (int)uVar8) * lVar53;
          local_468 = (double *)(local_504 * lVar53 + (long)local_2f8);
          local_470 = (double *)(local_500 * lVar53 + (long)local_2f8);
          pdVar77 = (double *)(local_4fc * lVar53 + (long)local_2f8);
          pdVar63 = (double *)(local_4f8 * lVar53 + (long)local_2f8);
          lVar69 = (lVar64 - iVar9) * lVar30 * 8;
          local_478 = (long)pdVar29 + lVar69 + lVar28 * 0x10 + lVar75 + lVar62 * -8;
          lVar72 = (long)pdVar29 + lVar69 + lVar75 + lVar28 * 8 + lVar62 * -8;
          lVar70 = (long)pdVar29 + lVar69 + lVar75 + lVar62 * -8;
          lVar56 = (int)(iVar57 - uVar8) * lVar27;
          pdVar73 = (double *)((long)local_2f8 + lVar66);
          local_2a0 = local_458;
          local_3c8 = local_450;
          local_3d0 = local_448;
          local_280 = local_440;
          local_3d8 = local_438;
          local_2a8 = local_430;
          local_3e0 = local_428;
          local_3e8 = local_420;
          local_288 = local_418;
          local_3f0 = local_410;
          lVar69 = lVar76;
          local_4f0 = iVar51 + 2;
          local_4e8 = iVar51 + -1;
          local_4e4 = iVar51 + -2;
          local_4ec = iVar51;
          do {
            local_4ec = local_4ec + 1;
            if (iVar3 <= iVar19) {
              lVar65 = (lVar69 - (int)uVar6) * lVar26;
              lVar67 = 0;
              do {
                iVar60 = (int)lVar67;
                dVar84 = pdVar31[lVar65 + lVar56 + lVar68 + (iVar74 + -1 + iVar60)];
                dVar85 = pdVar73[lVar67];
                dVar83 = pdVar31[lVar65 + lVar56 + lVar68 + (iVar74 + 1 + iVar60)];
                dVar89 = (dVar83 - dVar85) + (dVar83 - dVar85);
                dVar90 = (dVar85 - dVar84) + (dVar85 - dVar84);
                dVar86 = 0.0;
                dVar79 = ABS(dVar89);
                dVar80 = ABS(dVar90);
                dVar92 = 0.0;
                uVar50 = (ulong)DAT_0078ba10;
                if (1.0000000000000001e-20 < dVar90 * dVar89) {
                  dVar81 = (dVar83 - dVar84) * 0.5;
                  dVar82 = ABS(dVar81);
                  dVar92 = dVar79;
                  if (dVar80 <= dVar79) {
                    dVar92 = dVar80;
                  }
                  if (dVar82 <= dVar92) {
                    dVar92 = dVar82;
                  }
                  dVar92 = dVar92 * (double)((ulong)dVar81 & 0x8000000000000000 | uVar50);
                }
                dVar81 = dVar84 - pdVar31[lVar65 + lVar56 + lVar68 + (iVar74 + -2 + iVar60)];
                dVar81 = dVar81 + dVar81;
                if (1.0000000000000001e-20 < dVar81 * dVar90) {
                  dVar82 = (dVar85 - pdVar31[lVar65 + lVar56 + lVar68 + (iVar74 + -2 + iVar60)]) *
                           0.5;
                  dVar87 = ABS(dVar82);
                  dVar81 = ABS(dVar81);
                  dVar86 = ABS(dVar90);
                  if (dVar81 <= ABS(dVar90)) {
                    dVar86 = dVar81;
                  }
                  if (dVar87 <= dVar86) {
                    dVar86 = dVar87;
                  }
                  dVar86 = dVar86 * (double)((ulong)dVar82 & 0x8000000000000000 | uVar50);
                }
                dVar81 = pdVar31[lVar65 + lVar56 + lVar68 + (iVar74 + iVar60 + 2)] - dVar83;
                dVar81 = dVar81 + dVar81;
                dVar82 = 0.0;
                dVar87 = 0.0;
                if (1.0000000000000001e-20 < dVar89 * dVar81) {
                  dVar87 = (pdVar31[lVar65 + lVar56 + lVar68 + (iVar74 + iVar60 + 2)] - dVar85) *
                           0.5;
                  dVar88 = ABS(dVar87);
                  dVar81 = ABS(dVar81);
                  if (ABS(dVar89) <= dVar81) {
                    dVar81 = ABS(dVar89);
                  }
                  if (dVar88 <= dVar81) {
                    dVar81 = dVar88;
                  }
                  dVar87 = dVar81 * (double)((ulong)dVar87 & 0x8000000000000000 | uVar50);
                }
                if (1.0000000000000001e-20 < dVar90 * dVar89) {
                  dVar89 = (dVar83 - dVar84) * 0.5;
                  dVar90 = ABS(dVar89);
                  if (dVar80 <= dVar79) {
                    dVar79 = dVar80;
                  }
                  if (dVar90 <= dVar79) {
                    dVar79 = dVar90;
                  }
                  dVar82 = dVar79 * (double)((ulong)dVar89 & 0x8000000000000000 | uVar50);
                }
                dVar92 = (dVar84 + dVar85) * 0.5 + (dVar92 - dVar86) * -0.16666666666666666;
                dVar86 = dVar84;
                if (dVar85 <= dVar84) {
                  dVar86 = dVar85;
                }
                if (dVar86 <= dVar92) {
                  dVar86 = dVar92;
                }
                if (dVar84 <= dVar85) {
                  dVar84 = dVar85;
                }
                if (dVar86 <= dVar84) {
                  dVar84 = dVar86;
                }
                dVar92 = (dVar85 + dVar83) * 0.5 + (dVar87 - dVar82) * -0.16666666666666666;
                dVar86 = dVar83;
                if (dVar85 <= dVar83) {
                  dVar86 = dVar85;
                }
                if (dVar86 <= dVar92) {
                  dVar86 = dVar92;
                }
                if (dVar83 <= dVar85) {
                  dVar83 = dVar85;
                }
                if (dVar86 <= dVar83) {
                  dVar83 = dVar86;
                }
                dVar86 = dVar85;
                dVar92 = dVar85;
                if (0.0 <= (dVar85 - dVar84) * (dVar83 - dVar85)) {
                  dVar79 = ABS(dVar83 - dVar85);
                  dVar80 = ABS(dVar84 - dVar85);
                  dVar92 = dVar84;
                  if (dVar80 + dVar80 <= dVar79) {
                    dVar86 = dVar85 * 3.0 - (dVar84 + dVar84);
                  }
                  else {
                    dVar86 = dVar83;
                    if (dVar79 + dVar79 <= dVar80) {
                      dVar92 = dVar85 * 3.0 - (dVar83 + dVar83);
                    }
                  }
                }
                dVar79 = *(double *)(lVar70 + lVar67 * 8);
                if (pBVar1->bc[0] - 3U < 2) {
                  if (geom.domain.smallend.vect[0] - lVar61 == lVar67) {
                    dVar92 = pdVar31[lVar65 + lVar56 + lVar54 + lVar68];
                    dVar83 = pdVar31[lVar65 + lVar56 + iVar58 + lVar68];
                    dVar80 = pdVar31[lVar65 + lVar56 + lVar55 + lVar68];
                    dVar89 = dVar83;
                    if (dVar80 <= dVar83) {
                      dVar89 = dVar80;
                    }
                    dVar86 = dVar83;
                    if (dVar83 <= dVar80) {
                      dVar86 = dVar80;
                    }
                    dVar83 = pdVar31[lVar65 + lVar56 + (iVar58 + 2) + lVar68] * -0.05 +
                             dVar80 * 0.5 + dVar92 * -0.2 + dVar83 * 0.75;
                    if (dVar89 <= dVar83) {
                      dVar89 = dVar83;
                    }
                    if (dVar89 <= dVar86) {
                      dVar86 = dVar89;
                    }
                  }
                  else if ((geom.domain.smallend.vect[0] + 1) - lVar61 == lVar67) {
                    dVar84 = pdVar31[lVar65 + lVar56 + iVar58 + lVar68];
                    dVar80 = pdVar31[lVar65 + lVar56 + lVar55 + lVar68];
                    dVar92 = pdVar31[lVar65 + lVar56 + (iVar58 + 2) + lVar68] * -0.05 +
                             dVar80 * 0.5 +
                             pdVar31[lVar65 + lVar56 + lVar54 + lVar68] * -0.2 + dVar84 * 0.75;
                    dVar86 = dVar84;
                    if (dVar80 <= dVar84) {
                      dVar86 = dVar80;
                    }
                    if (dVar86 <= dVar92) {
                      dVar86 = dVar92;
                    }
                    if (dVar84 <= dVar80) {
                      dVar84 = dVar80;
                    }
                    if (dVar86 <= dVar84) {
                      dVar84 = dVar86;
                    }
                    dVar86 = dVar80;
                    dVar92 = dVar80;
                    if (0.0 < (dVar80 - dVar84) * (dVar83 - dVar80)) {
                      dVar89 = ABS(dVar83 - dVar80);
                      dVar90 = ABS(dVar84 - dVar80);
                      dVar92 = dVar84;
                      if (dVar90 + dVar90 <= dVar89) {
                        dVar86 = dVar80 * 3.0 - (dVar84 + dVar84);
                      }
                      else {
                        dVar86 = dVar83;
                        if (dVar89 + dVar89 <= dVar90) {
                          dVar92 = dVar80 * 3.0 - (dVar83 + dVar83);
                        }
                      }
                    }
                  }
                }
                if (pBVar1->bc[3] - 3U < 2) {
                  if (geom.domain.bigend.vect[0] - lVar61 == lVar67) {
                    dVar86 = pdVar31[lVar65 + lVar56 + (iVar59 + 1) + lVar68];
                    dVar84 = pdVar31[lVar65 + lVar56 + iVar59 + lVar68];
                    dVar83 = pdVar31[lVar65 + lVar56 + (int)(~uVar7 + geom.domain.bigend.vect[0]) +
                                                       lVar68];
                    dVar80 = dVar84;
                    if (dVar83 <= dVar84) {
                      dVar80 = dVar83;
                    }
                    dVar92 = dVar84;
                    if (dVar84 <= dVar83) {
                      dVar92 = dVar83;
                    }
                    dVar84 = pdVar31[lVar65 + lVar56 + (iVar59 + -2) + lVar68] * -0.05 +
                             dVar83 * 0.5 + dVar86 * -0.2 + dVar84 * 0.75;
                    if (dVar80 <= dVar84) {
                      dVar80 = dVar84;
                    }
                    if (dVar80 <= dVar92) {
                      dVar92 = dVar80;
                    }
                  }
                  else if ((geom.domain.bigend.vect[0] + -1) - lVar61 == lVar67) {
                    dVar83 = pdVar31[lVar65 + lVar56 + iVar59 + lVar68];
                    dVar80 = pdVar31[lVar65 + lVar56 + (int)((geom.domain.bigend.vect[0] + -1) -
                                                            uVar7) + lVar68];
                    dVar92 = pdVar31[lVar65 + lVar56 + (iVar59 + -2) + lVar68] * -0.05 +
                             dVar80 * 0.5 +
                             pdVar31[lVar65 + lVar56 + (iVar59 + 1) + lVar68] * -0.2 + dVar83 * 0.75
                    ;
                    dVar86 = dVar83;
                    if (dVar80 <= dVar83) {
                      dVar86 = dVar80;
                    }
                    if (dVar86 <= dVar92) {
                      dVar86 = dVar92;
                    }
                    if (dVar83 <= dVar80) {
                      dVar83 = dVar80;
                    }
                    if (dVar86 <= dVar83) {
                      dVar83 = dVar86;
                    }
                    dVar86 = dVar80;
                    dVar92 = dVar80;
                    if (0.0 < (dVar80 - dVar84) * (dVar83 - dVar80)) {
                      dVar89 = ABS(dVar83 - dVar80);
                      dVar90 = ABS(dVar84 - dVar80);
                      dVar92 = dVar84;
                      if (dVar90 + dVar90 <= dVar89) {
                        dVar86 = dVar80 * 3.0 - (dVar84 + dVar84);
                      }
                      else {
                        dVar86 = dVar83;
                        if (dVar89 + dVar89 <= dVar90) {
                          dVar92 = dVar80 * 3.0 - (dVar83 + dVar83);
                        }
                      }
                    }
                  }
                }
                dVar83 = dVar85 * 6.0 + (dVar92 + dVar86) * -3.0;
                dVar84 = ABS(dVar79) * (dt / geom.super_CoordSys.dx[0]);
                if (dVar79 <= 1e-08) {
                  local_520[lVar67] = dVar85;
                  if (-1e-08 <= dVar79) goto LAB_003a0a90;
                  dVar92 = ((dVar84 * -0.6666666666666666 + 1.0) * dVar83 + (dVar86 - dVar92)) *
                           dVar84 * 0.5 + dVar92;
                }
                else {
                  local_520[lVar67] =
                       dVar84 * -0.5 *
                       ((dVar86 - dVar92) - (dVar84 * -0.6666666666666666 + 1.0) * dVar83) + dVar86;
LAB_003a0a90:
                  dVar92 = pdVar73[lVar67];
                }
                local_510[lVar67] = dVar92;
                dVar84 = *(double *)(lVar72 + lVar67 * 8);
                dVar85 = *(double *)((long)local_408 + lVar67 * 8 + local_4e4 * lVar71 + lVar66);
                dVar83 = *(double *)((long)local_408 + lVar67 * 8 + local_4e8 * lVar71 + lVar66);
                dVar86 = pdVar73[lVar67];
                dVar92 = *(double *)((long)local_408 + lVar67 * 8 + local_4ec * lVar71 + lVar66);
                dVar79 = *(double *)((long)local_408 + lVar67 * 8 + local_4f0 * lVar71 + lVar66);
                dVar82 = (dVar92 - dVar86) + (dVar92 - dVar86);
                dVar87 = (dVar86 - dVar83) + (dVar86 - dVar83);
                dVar89 = 0.0;
                dVar80 = ABS(dVar82);
                dVar81 = ABS(dVar87);
                dVar90 = 0.0;
                uVar50 = (ulong)DAT_0078ba10;
                if (1.0000000000000001e-20 < dVar87 * dVar82) {
                  dVar88 = (dVar92 - dVar83) * 0.5;
                  dVar91 = ABS(dVar88);
                  dVar90 = dVar80;
                  if (dVar81 <= dVar80) {
                    dVar90 = dVar81;
                  }
                  if (dVar91 <= dVar90) {
                    dVar90 = dVar91;
                  }
                  dVar90 = dVar90 * (double)((ulong)dVar88 & 0x8000000000000000 | uVar50);
                }
                dVar88 = dVar83 - dVar85;
                dVar88 = dVar88 + dVar88;
                if (1.0000000000000001e-20 < dVar88 * dVar87) {
                  dVar85 = (dVar86 - dVar85) * 0.5;
                  dVar91 = ABS(dVar85);
                  dVar88 = ABS(dVar88);
                  dVar89 = ABS(dVar87);
                  if (dVar88 <= ABS(dVar87)) {
                    dVar89 = dVar88;
                  }
                  if (dVar91 <= dVar89) {
                    dVar89 = dVar91;
                  }
                  dVar89 = dVar89 * (double)((ulong)dVar85 & 0x8000000000000000 | uVar50);
                }
                dVar85 = dVar79 - dVar92;
                dVar85 = dVar85 + dVar85;
                dVar88 = 0.0;
                dVar91 = 0.0;
                if (1.0000000000000001e-20 < dVar82 * dVar85) {
                  dVar79 = (dVar79 - dVar86) * 0.5;
                  dVar91 = ABS(dVar79);
                  dVar85 = ABS(dVar85);
                  if (ABS(dVar82) <= dVar85) {
                    dVar85 = ABS(dVar82);
                  }
                  if (dVar91 <= dVar85) {
                    dVar85 = dVar91;
                  }
                  dVar91 = dVar85 * (double)((ulong)dVar79 & 0x8000000000000000 | uVar50);
                }
                if (1.0000000000000001e-20 < dVar87 * dVar82) {
                  dVar85 = (dVar92 - dVar83) * 0.5;
                  dVar79 = ABS(dVar85);
                  if (dVar81 <= dVar80) {
                    dVar80 = dVar81;
                  }
                  if (dVar79 <= dVar80) {
                    dVar80 = dVar79;
                  }
                  dVar88 = dVar80 * (double)((ulong)dVar85 & 0x8000000000000000 | uVar50);
                }
                dVar79 = (dVar83 + dVar86) * 0.5 + (dVar90 - dVar89) * -0.16666666666666666;
                dVar85 = dVar83;
                if (dVar86 <= dVar83) {
                  dVar85 = dVar86;
                }
                if (dVar85 <= dVar79) {
                  dVar85 = dVar79;
                }
                if (dVar83 <= dVar86) {
                  dVar83 = dVar86;
                }
                if (dVar85 <= dVar83) {
                  dVar83 = dVar85;
                }
                dVar79 = (dVar86 + dVar92) * 0.5 + (dVar91 - dVar88) * -0.16666666666666666;
                dVar85 = dVar92;
                if (dVar86 <= dVar92) {
                  dVar85 = dVar86;
                }
                if (dVar85 <= dVar79) {
                  dVar85 = dVar79;
                }
                if (dVar92 <= dVar86) {
                  dVar92 = dVar86;
                }
                if (dVar85 <= dVar92) {
                  dVar92 = dVar85;
                }
                dVar79 = dVar86;
                dVar85 = dVar86;
                if (0.0 <= (dVar86 - dVar83) * (dVar92 - dVar86)) {
                  dVar89 = ABS(dVar92 - dVar86);
                  dVar80 = ABS(dVar83 - dVar86);
                  dVar79 = dVar83;
                  if (dVar80 + dVar80 <= dVar89) {
                    dVar85 = dVar86 * 3.0 - (dVar83 + dVar83);
                  }
                  else {
                    dVar85 = dVar92;
                    if (dVar89 + dVar89 <= dVar80) {
                      dVar79 = dVar86 * 3.0 - (dVar92 + dVar92);
                    }
                  }
                }
                if (pBVar1->bc[1] - 3U < 2) {
                  if (lVar69 == geom.domain.smallend.vect[1]) {
                    dVar79 = *(double *)((long)local_4b0 + lVar67 * 8 + lVar66);
                    dVar92 = *(double *)((long)local_4a8 + lVar67 * 8 + lVar66);
                    dVar80 = *(double *)((long)local_4a0 + lVar67 * 8 + lVar66);
                    dVar89 = dVar92;
                    if (dVar80 <= dVar92) {
                      dVar89 = dVar80;
                    }
                    dVar85 = dVar92;
                    if (dVar92 <= dVar80) {
                      dVar85 = dVar80;
                    }
                    dVar92 = *(double *)((long)local_518 + lVar67 * 8 + lVar66) * -0.05 +
                             dVar80 * 0.5 + dVar79 * -0.2 + dVar92 * 0.75;
                    if (dVar89 <= dVar92) {
                      dVar89 = dVar92;
                    }
                    if (dVar89 <= dVar85) {
                      dVar85 = dVar89;
                    }
                  }
                  else if (lVar69 == geom.domain.smallend.vect[1] + 1) {
                    dVar83 = *(double *)((long)local_4a8 + lVar67 * 8 + lVar66);
                    dVar80 = *(double *)((long)local_4b8 + lVar67 * 8 + lVar66);
                    dVar79 = *(double *)((long)local_518 + lVar67 * 8 + lVar66) * -0.05 +
                             dVar80 * 0.5 +
                             *(double *)((long)local_4b0 + lVar67 * 8 + lVar66) * -0.2 +
                             dVar83 * 0.75;
                    dVar85 = dVar83;
                    if (dVar80 <= dVar83) {
                      dVar85 = dVar80;
                    }
                    if (dVar85 <= dVar79) {
                      dVar85 = dVar79;
                    }
                    if (dVar83 <= dVar80) {
                      dVar83 = dVar80;
                    }
                    if (dVar85 <= dVar83) {
                      dVar83 = dVar85;
                    }
                    dVar79 = dVar80;
                    dVar85 = dVar80;
                    if (0.0 < (dVar80 - dVar83) * (dVar92 - dVar80)) {
                      dVar89 = ABS(dVar92 - dVar80);
                      dVar90 = ABS(dVar83 - dVar80);
                      dVar79 = dVar83;
                      if (dVar90 + dVar90 <= dVar89) {
                        dVar85 = dVar80 * 3.0 - (dVar83 + dVar83);
                      }
                      else {
                        dVar85 = dVar92;
                        if (dVar89 + dVar89 <= dVar90) {
                          dVar79 = dVar80 * 3.0 - (dVar92 + dVar92);
                        }
                      }
                    }
                  }
                }
                if (pBVar1->bc[4] - 3U < 2) {
                  if (lVar69 == geom.domain.bigend.vect[1]) {
                    dVar85 = *(double *)((long)local_4d8 + lVar67 * 8 + lVar66);
                    dVar83 = *(double *)((long)local_4d0 + lVar67 * 8 + lVar66);
                    dVar92 = *(double *)((long)local_4c8 + lVar67 * 8 + lVar66);
                    dVar80 = dVar83;
                    if (dVar92 <= dVar83) {
                      dVar80 = dVar92;
                    }
                    dVar79 = dVar83;
                    if (dVar83 <= dVar92) {
                      dVar79 = dVar92;
                    }
                    dVar83 = *(double *)((long)local_4c0 + lVar67 * 8 + lVar66) * -0.05 +
                             dVar92 * 0.5 + dVar85 * -0.2 + dVar83 * 0.75;
                    if (dVar80 <= dVar83) {
                      dVar80 = dVar83;
                    }
                    if (dVar80 <= dVar79) {
                      dVar79 = dVar80;
                    }
                  }
                  else if (lVar69 == geom.domain.bigend.vect[1] + -1) {
                    dVar92 = *(double *)((long)local_4d0 + lVar67 * 8 + lVar66);
                    dVar80 = *(double *)((long)local_4e0 + lVar67 * 8 + lVar66);
                    dVar79 = *(double *)((long)local_4c0 + lVar67 * 8 + lVar66) * -0.05 +
                             dVar80 * 0.5 +
                             *(double *)((long)local_4d8 + lVar67 * 8 + lVar66) * -0.2 +
                             dVar92 * 0.75;
                    dVar85 = dVar92;
                    if (dVar80 <= dVar92) {
                      dVar85 = dVar80;
                    }
                    if (dVar85 <= dVar79) {
                      dVar85 = dVar79;
                    }
                    if (dVar92 <= dVar80) {
                      dVar92 = dVar80;
                    }
                    if (dVar85 <= dVar92) {
                      dVar92 = dVar85;
                    }
                    dVar79 = dVar80;
                    dVar85 = dVar80;
                    if (0.0 < (dVar80 - dVar83) * (dVar92 - dVar80)) {
                      dVar89 = ABS(dVar92 - dVar80);
                      dVar90 = ABS(dVar83 - dVar80);
                      dVar79 = dVar83;
                      if (dVar90 + dVar90 <= dVar89) {
                        dVar85 = dVar80 * 3.0 - (dVar83 + dVar83);
                      }
                      else {
                        dVar85 = dVar92;
                        if (dVar89 + dVar89 <= dVar90) {
                          dVar79 = dVar80 * 3.0 - (dVar92 + dVar92);
                        }
                      }
                    }
                  }
                }
                dVar92 = dVar86 * 6.0 + (dVar79 + dVar85) * -3.0;
                dVar83 = ABS(dVar84) * (dt / geom.super_CoordSys.dx[1]);
                if (dVar84 <= 1e-08) {
                  if (-1e-08 <= dVar84) {
                    local_530[lVar67] = dVar86;
                    goto LAB_003a122b;
                  }
                  local_530[lVar67] = dVar86;
                  dVar79 = ((dVar83 * -0.6666666666666666 + 1.0) * dVar92 + (dVar85 - dVar79)) *
                           dVar83 * 0.5 + dVar79;
                }
                else {
                  local_530[lVar67] =
                       dVar83 * -0.5 *
                       ((dVar85 - dVar79) - (dVar83 * -0.6666666666666666 + 1.0) * dVar92) + dVar85;
LAB_003a122b:
                  dVar79 = pdVar73[lVar67];
                }
                pdVar37[(lVar69 - iVar12) * lVar38 +
                        (lVar64 - iVar13) * lVar39 +
                        local_460 * lVar40 + ((lVar61 + lVar67) - (long)iVar5)] = dVar79;
                dVar84 = *(double *)(local_478 + lVar67 * 8);
                dVar85 = pdVar77[lVar67];
                dVar83 = pdVar73[lVar67];
                dVar86 = local_470[lVar67];
                dVar90 = (dVar86 - dVar83) + (dVar86 - dVar83);
                dVar81 = (dVar83 - dVar85) + (dVar83 - dVar85);
                dVar79 = 0.0;
                dVar92 = ABS(dVar90);
                dVar89 = ABS(dVar81);
                dVar80 = 0.0;
                uVar50 = (ulong)DAT_0078ba10;
                if (1.0000000000000001e-20 < dVar81 * dVar90) {
                  dVar82 = (dVar86 - dVar85) * 0.5;
                  dVar87 = ABS(dVar82);
                  dVar80 = dVar92;
                  if (dVar89 <= dVar92) {
                    dVar80 = dVar89;
                  }
                  if (dVar87 <= dVar80) {
                    dVar80 = dVar87;
                  }
                  dVar80 = dVar80 * (double)((ulong)dVar82 & 0x8000000000000000 | uVar50);
                }
                dVar82 = dVar85 - pdVar63[lVar67];
                dVar82 = dVar82 + dVar82;
                if (1.0000000000000001e-20 < dVar82 * dVar81) {
                  dVar87 = (dVar83 - pdVar63[lVar67]) * 0.5;
                  dVar88 = ABS(dVar87);
                  dVar82 = ABS(dVar82);
                  dVar79 = ABS(dVar81);
                  if (dVar82 <= ABS(dVar81)) {
                    dVar79 = dVar82;
                  }
                  if (dVar88 <= dVar79) {
                    dVar79 = dVar88;
                  }
                  dVar79 = dVar79 * (double)((ulong)dVar87 & 0x8000000000000000 | uVar50);
                }
                dVar82 = local_468[lVar67] - dVar86;
                dVar82 = dVar82 + dVar82;
                dVar87 = 0.0;
                dVar88 = 0.0;
                if (1.0000000000000001e-20 < dVar90 * dVar82) {
                  dVar88 = (local_468[lVar67] - dVar83) * 0.5;
                  dVar91 = ABS(dVar88);
                  dVar82 = ABS(dVar82);
                  if (ABS(dVar90) <= dVar82) {
                    dVar82 = ABS(dVar90);
                  }
                  if (dVar91 <= dVar82) {
                    dVar82 = dVar91;
                  }
                  dVar88 = dVar82 * (double)((ulong)dVar88 & 0x8000000000000000 | uVar50);
                }
                if (1.0000000000000001e-20 < dVar81 * dVar90) {
                  dVar90 = (dVar86 - dVar85) * 0.5;
                  dVar81 = ABS(dVar90);
                  if (dVar89 <= dVar92) {
                    dVar92 = dVar89;
                  }
                  if (dVar81 <= dVar92) {
                    dVar92 = dVar81;
                  }
                  dVar87 = dVar92 * (double)((ulong)dVar90 & 0x8000000000000000 | uVar50);
                }
                dVar79 = (dVar85 + dVar83) * 0.5 + (dVar80 - dVar79) * -0.16666666666666666;
                dVar92 = dVar85;
                if (dVar83 <= dVar85) {
                  dVar92 = dVar83;
                }
                if (dVar92 <= dVar79) {
                  dVar92 = dVar79;
                }
                if (dVar85 <= dVar83) {
                  dVar85 = dVar83;
                }
                if (dVar92 <= dVar85) {
                  dVar85 = dVar92;
                }
                dVar79 = (dVar83 + dVar86) * 0.5 + (dVar88 - dVar87) * -0.16666666666666666;
                dVar92 = dVar86;
                if (dVar83 <= dVar86) {
                  dVar92 = dVar83;
                }
                if (dVar92 <= dVar79) {
                  dVar92 = dVar79;
                }
                if (dVar86 <= dVar83) {
                  dVar86 = dVar83;
                }
                if (dVar92 <= dVar86) {
                  dVar86 = dVar92;
                }
                dVar79 = dVar83;
                dVar92 = dVar83;
                if (0.0 <= (dVar83 - dVar85) * (dVar86 - dVar83)) {
                  dVar89 = ABS(dVar86 - dVar83);
                  dVar80 = ABS(dVar85 - dVar83);
                  dVar79 = dVar85;
                  if (dVar80 + dVar80 <= dVar89) {
                    dVar92 = dVar83 * 3.0 - (dVar85 + dVar85);
                  }
                  else {
                    dVar92 = dVar86;
                    if (dVar89 + dVar89 <= dVar80) {
                      dVar79 = dVar83 * 3.0 - (dVar86 + dVar86);
                    }
                  }
                }
                if (pBVar1->bc[2] - 3U < 2) {
                  if (geom.domain.smallend.vect[2] == iVar57) {
                    dVar79 = local_3e0[lVar67];
                    dVar86 = local_3e8[lVar67];
                    dVar80 = local_288[lVar67];
                    dVar89 = dVar86;
                    if (dVar80 <= dVar86) {
                      dVar89 = dVar80;
                    }
                    dVar92 = dVar86;
                    if (dVar86 <= dVar80) {
                      dVar92 = dVar80;
                    }
                    dVar86 = local_3f0[lVar67] * -0.05 +
                             dVar80 * 0.5 + dVar79 * -0.2 + dVar86 * 0.75;
                    if (dVar89 <= dVar86) {
                      dVar89 = dVar86;
                    }
                    if (dVar89 <= dVar92) {
                      dVar92 = dVar89;
                    }
                  }
                  else if (geom.domain.smallend.vect[2] + 1 == iVar57) {
                    dVar85 = local_3e8[lVar67];
                    dVar80 = local_2a8[lVar67];
                    dVar79 = local_3f0[lVar67] * -0.05 +
                             dVar80 * 0.5 + local_3e0[lVar67] * -0.2 + dVar85 * 0.75;
                    dVar92 = dVar85;
                    if (dVar80 <= dVar85) {
                      dVar92 = dVar80;
                    }
                    if (dVar92 <= dVar79) {
                      dVar92 = dVar79;
                    }
                    if (dVar85 <= dVar80) {
                      dVar85 = dVar80;
                    }
                    if (dVar92 <= dVar85) {
                      dVar85 = dVar92;
                    }
                    dVar79 = dVar80;
                    dVar92 = dVar80;
                    if (0.0 < (dVar80 - dVar85) * (dVar86 - dVar80)) {
                      dVar89 = ABS(dVar86 - dVar80);
                      dVar90 = ABS(dVar85 - dVar80);
                      dVar79 = dVar85;
                      if (dVar90 + dVar90 <= dVar89) {
                        dVar92 = dVar80 * 3.0 - (dVar85 + dVar85);
                      }
                      else {
                        dVar92 = dVar86;
                        if (dVar89 + dVar89 <= dVar90) {
                          dVar79 = dVar80 * 3.0 - (dVar86 + dVar86);
                        }
                      }
                    }
                  }
                }
                if (pBVar1->bc[5] - 3U < 2) {
                  if (geom.domain.bigend.vect[2] == iVar57) {
                    dVar92 = local_3c8[lVar67];
                    dVar85 = local_3d0[lVar67];
                    dVar86 = local_280[lVar67];
                    dVar80 = dVar85;
                    if (dVar86 <= dVar85) {
                      dVar80 = dVar86;
                    }
                    dVar79 = dVar85;
                    if (dVar85 <= dVar86) {
                      dVar79 = dVar86;
                    }
                    dVar85 = local_3d8[lVar67] * -0.05 +
                             dVar86 * 0.5 + dVar92 * -0.2 + dVar85 * 0.75;
                    if (dVar80 <= dVar85) {
                      dVar80 = dVar85;
                    }
                    if (dVar80 <= dVar79) {
                      dVar79 = dVar80;
                    }
                  }
                  else if (geom.domain.bigend.vect[2] + -1 == iVar57) {
                    dVar86 = local_3d0[lVar67];
                    dVar80 = local_2a0[lVar67];
                    dVar79 = local_3d8[lVar67] * -0.05 +
                             dVar80 * 0.5 + local_3c8[lVar67] * -0.2 + dVar86 * 0.75;
                    dVar92 = dVar86;
                    if (dVar80 <= dVar86) {
                      dVar92 = dVar80;
                    }
                    if (dVar92 <= dVar79) {
                      dVar92 = dVar79;
                    }
                    if (dVar86 <= dVar80) {
                      dVar86 = dVar80;
                    }
                    if (dVar92 <= dVar86) {
                      dVar86 = dVar92;
                    }
                    dVar79 = dVar80;
                    dVar92 = dVar80;
                    if (0.0 < (dVar80 - dVar85) * (dVar86 - dVar80)) {
                      dVar89 = ABS(dVar86 - dVar80);
                      dVar90 = ABS(dVar85 - dVar80);
                      dVar79 = dVar85;
                      if (dVar90 + dVar90 <= dVar89) {
                        dVar92 = dVar80 * 3.0 - (dVar85 + dVar85);
                      }
                      else {
                        dVar92 = dVar86;
                        if (dVar89 + dVar89 <= dVar90) {
                          dVar79 = dVar80 * 3.0 - (dVar86 + dVar86);
                        }
                      }
                    }
                  }
                }
                dVar86 = dVar83 * 6.0 + (dVar79 + dVar92) * -3.0;
                dVar85 = ABS(dVar84) * (dt / geom.super_CoordSys.dx[2]);
                if (dVar84 <= 1e-08) {
                  if (-1e-08 <= dVar84) {
                    local_538[lVar67] = dVar83;
                    goto LAB_003a19cc;
                  }
                  local_538[lVar67] = dVar83;
                  dVar79 = ((dVar85 * -0.6666666666666666 + 1.0) * dVar86 + (dVar92 - dVar79)) *
                           dVar85 * 0.5 + dVar79;
                }
                else {
                  local_538[lVar67] =
                       dVar85 * -0.5 *
                       ((dVar92 - dVar79) - (dVar85 * -0.6666666666666666 + 1.0) * dVar86) + dVar92;
LAB_003a19cc:
                  dVar79 = pdVar73[lVar67];
                }
                pdVar43[local_460 * lVar46 +
                        (iVar57 - iVar16) * lVar45 +
                        (lVar69 - iVar15) * lVar44 + ((lVar61 + lVar67) - (long)iVar2)] = dVar79;
                lVar67 = lVar67 + 1;
              } while ((iVar19 - iVar3) + 1 != (int)lVar67);
            }
            lVar69 = lVar69 + 1;
            local_510 = local_510 + lVar22;
            local_520 = local_520 + lVar23;
            local_530 = local_530 + lVar24;
            local_538 = local_538 + lVar25;
            local_4f0 = local_4f0 + 1;
            local_4e8 = local_4e8 + 1;
            local_4e4 = local_4e4 + 1;
            local_3f0 = local_3f0 + lVar26;
            local_288 = local_288 + lVar26;
            local_3e8 = local_3e8 + lVar26;
            local_3e0 = local_3e0 + lVar26;
            local_2a8 = local_2a8 + lVar26;
            local_3d8 = local_3d8 + lVar26;
            local_280 = local_280 + lVar26;
            local_3d0 = local_3d0 + lVar26;
            local_3c8 = local_3c8 + lVar26;
            local_2a0 = local_2a0 + lVar26;
            local_468 = local_468 + lVar26;
            local_470 = local_470 + lVar26;
            pdVar77 = pdVar77 + lVar26;
            pdVar63 = pdVar63 + lVar26;
            pdVar73 = pdVar73 + lVar26;
            local_478 = local_478 + lVar49;
            lVar72 = lVar72 + lVar49;
            lVar70 = lVar70 + lVar49;
          } while (iVar20 + 1 != (int)lVar69);
        }
        local_504 = local_504 + 1;
        local_4fc = local_4fc + 1;
        local_4f8 = local_4f8 + 1;
        bVar78 = iVar57 != iVar21;
        iVar57 = iVar57 + 1;
      } while (bVar78);
    }
    local_460 = local_460 + 1;
    local_480 = local_480 + lVar34;
    local_488 = local_488 + lVar36;
    local_490 = local_490 + lVar42;
    local_498 = local_498 + lVar48;
    local_518 = local_518 + lVar32;
    local_4a0 = local_4a0 + lVar32;
    local_4a8 = local_4a8 + lVar32;
    local_4b0 = local_4b0 + lVar32;
    local_4b8 = local_4b8 + lVar32;
    local_4c0 = local_4c0 + lVar32;
    local_4c8 = local_4c8 + lVar32;
    local_4d0 = local_4d0 + lVar32;
    local_4d8 = local_4d8 + lVar32;
    local_4e0 = local_4e0 + lVar32;
    local_408 = local_408 + lVar32;
    local_410 = local_410 + lVar32;
    local_418 = local_418 + lVar32;
    local_420 = local_420 + lVar32;
    local_428 = local_428 + lVar32;
    local_430 = local_430 + lVar32;
    local_438 = local_438 + lVar32;
    local_440 = local_440 + lVar32;
    local_448 = local_448 + lVar32;
    local_450 = local_450 + lVar32;
    local_458 = local_458 + lVar32;
    local_2f8 = local_2f8 + lVar32;
    if (local_460 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
PPM::PredictVelOnFaces (Box const& bx,
                        AMREX_D_DECL( Array4<Real> const& Imx,
                                      Array4<Real> const& Imy,
                                      Array4<Real> const& Imz),
                        AMREX_D_DECL( Array4<Real> const& Ipx,
                                      Array4<Real> const& Ipy,
                                      Array4<Real> const& Ipz),
                        Array4<Real const> const& q,
                        Array4<Real const> const& vel,
                        Geometry geom,
                        Real dt,
                        BCRec const* pbc)
{
    const Box& domain = geom.Domain();
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    const auto dx = geom.CellSizeArray();
    AMREX_D_TERM( Real l_dtdx = dt / dx[0];,
                  Real l_dtdy = dt / dx[1];,
                  Real l_dtdz = dt / dx[2];);

    amrex::ParallelFor(bx, AMREX_SPACEDIM,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        PredictVelOnXFace(i,j,k,n,l_dtdx,vel(i,j,k,0),q,Imx,Ipx,pbc[n],dlo.x,dhi.x);
        PredictVelOnYFace(i,j,k,n,l_dtdy,vel(i,j,k,1),q,Imy,Ipy,pbc[n],dlo.y,dhi.y);
#if (AMREX_SPACEDIM==3)
        PredictVelOnZFace(i,j,k,n,l_dtdz,vel(i,j,k,2),q,Imz,Ipz,pbc[n],dlo.z,dhi.z);
#endif
    });
}